

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state duckdb_appender_flush(duckdb_appender appender)

{
  type this;
  duckdb_state dVar1;
  ErrorData error;
  
  dVar1 = DuckDBError;
  if ((appender != (duckdb_appender)0x0) && (*(long *)appender != 0)) {
    this = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator*((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                     appender);
    dVar1 = DuckDBSuccess;
    duckdb::BaseAppender::Flush(&this->super_BaseAppender);
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_appender_flush(duckdb_appender appender) {
	return duckdb_appender_run_function(appender, [&](Appender &appender) { appender.Flush(); });
}